

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QIcon __thiscall QWidget::windowIcon(QWidget *this)

{
  long lVar1;
  undefined8 *puVar2;
  QIcon *pQVar3;
  bool bVar4;
  long in_RSI;
  
  do {
    if (in_RSI == 0) {
      QGuiApplication::windowIcon();
      return (QIcon)(QIconPrivate *)this;
    }
    lVar1 = *(long *)(*(long *)(in_RSI + 8) + 0x78);
    if (((lVar1 == 0) || (puVar2 = *(undefined8 **)(lVar1 + 8), puVar2 == (undefined8 *)0x0)) ||
       (pQVar3 = (QIcon *)*puVar2, pQVar3 == (QIcon *)0x0)) {
      in_RSI = *(long *)(*(long *)(in_RSI + 8) + 0x10);
      bVar4 = true;
    }
    else {
      QIcon::QIcon((QIcon *)this,pQVar3);
      bVar4 = false;
    }
  } while (bVar4);
  return (QIcon)(QIconPrivate *)this;
}

Assistant:

QIcon QWidget::windowIcon() const
{
    const QWidget *w = this;
    while (w) {
        const QWidgetPrivate *d = w->d_func();
        if (d->extra && d->extra->topextra && d->extra->topextra->icon)
            return *d->extra->topextra->icon;
        w = w->parentWidget();
    }
    return QApplication::windowIcon();
}